

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

download_priority_t __thiscall
libtorrent::aux::torrent::file_priority(torrent *this,file_index_t index)

{
  element_type *this_00;
  pointer psVar1;
  bool bVar2;
  uchar uVar3;
  file_index_t fVar4;
  file_storage *fs;
  
  if (index.m_val < 0) {
    return (download_priority_t)'\0';
  }
  this_00 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00->m_files).m_piece_length < 1) {
LAB_0031e8fb:
    psVar1 = (this->m_file_priority).
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = '\x04';
    if (index.m_val <
        *(int *)&(this->m_file_priority).
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) {
      uVar3 = psVar1[(uint)index.m_val].m_val;
    }
  }
  else {
    fVar4 = file_storage::end_file(&this_00->m_files);
    if (index.m_val < fVar4.m_val) {
      bVar2 = file_storage::pad_file_at(&this_00->m_files,index);
      if (!bVar2) goto LAB_0031e8fb;
    }
    uVar3 = '\0';
  }
  return (download_priority_t)uVar3;
}

Assistant:

constexpr bool operator<(strong_typedef const& rhs) const { return m_val < rhs.m_val; }